

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

timestamp_t __thiscall
duckdb::Interpolator<false>::Extract<duckdb::date_t,duckdb::timestamp_t>
          (Interpolator<false> *this,date_t *dest,Vector *result)

{
  date_t dVar1;
  timestamp_t tVar2;
  bool bVar3;
  double dVar4;
  undefined1 auVar5 [12];
  timestamp_t result_1;
  timestamp_t local_48;
  string local_40;
  
  dVar1 = (date_t)dest->days;
  if (this->CRN == this->FRN) {
    bVar3 = duckdb::TryCast::Operation<duckdb::date_t,duckdb::timestamp_t>(dVar1,&local_48,false);
    if (!bVar3) {
      auVar5 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::date_t,duckdb::timestamp_t>
                (&local_40,(duckdb *)(ulong)(uint)dVar1.days,(date_t)auVar5._8_4_);
      duckdb::InvalidInputException::InvalidInputException(auVar5._0_8_,(string *)&local_40);
      __cxa_throw(auVar5._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    bVar3 = duckdb::TryCast::Operation<duckdb::date_t,duckdb::timestamp_t>(dVar1,&local_48,false);
    tVar2.value = local_48.value;
    if (!bVar3) {
      auVar5 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::date_t,duckdb::timestamp_t>
                (&local_40,(duckdb *)(ulong)(uint)dVar1.days,(date_t)auVar5._8_4_);
      duckdb::InvalidInputException::InvalidInputException(auVar5._0_8_,(string *)&local_40);
      __cxa_throw(auVar5._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    dVar1.days = dest[1].days;
    bVar3 = duckdb::TryCast::Operation<duckdb::date_t,duckdb::timestamp_t>(dVar1,&local_48,false);
    if (!bVar3) {
      auVar5 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::date_t,duckdb::timestamp_t>
                (&local_40,(duckdb *)(ulong)(uint)dVar1.days,(date_t)auVar5._8_4_);
      duckdb::InvalidInputException::InvalidInputException(auVar5._0_8_,(string *)&local_40);
      __cxa_throw(auVar5._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    dVar4 = this->RN -
            (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0));
    local_48.value = llround(dVar4 * (double)local_48.value + (1.0 - dVar4) * (double)tVar2.value);
  }
  return (timestamp_t)local_48.value;
}

Assistant:

inline TARGET_TYPE Extract(const INPUT_TYPE *dest, Vector &result) const {
		if (CRN == FRN) {
			return CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[0], result);
		} else {
			auto lo = CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[0], result);
			auto hi = CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[1], result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}